

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.h
# Opt level: O2

char * __thiscall
NativeCodeData::AllocatorNoFixup<NativeCodeData::Array<GlobalBailOutRecordDataRow>_>::AllocZero
          (AllocatorNoFixup<NativeCodeData::Array<GlobalBailOutRecordDataRow>_> *this,
          size_t requestedBytes)

{
  char *pcVar1;
  
  pcVar1 = Allocator::AllocZero(&this->super_Allocator,requestedBytes);
  return pcVar1;
}

Assistant:

char * AllocZero(size_t requestedBytes)
        {
            char* dataBlock = __super::AllocZero(requestedBytes);

#if DBG
            if (JITManager::GetJITManager()->IsJITServer())
            {
                DataChunk* chunk = NativeCodeData::GetDataChunk(dataBlock);
                chunk->dataType = typeid(T).name();
                if (PHASE_TRACE1(Js::NativeCodeDataPhase))
                {
                    Output::Print(_u("NativeCodeData AllocNoFix: chunk: %p, data: %p, index: %d, len: %x, totalOffset: %x, type: %S\n"),
                        chunk, (void*)dataBlock, chunk->allocIndex, chunk->len, chunk->offset, chunk->dataType);
                }
            }
#endif

            return dataBlock;
        }